

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  char *pcVar4;
  reference ppcVar5;
  cmake *this_00;
  cmGlobalGenerator *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  value_type local_748;
  value_type local_720;
  value_type local_6a0;
  value_type local_678;
  char *local_670;
  char *local_668;
  allocator<char> local_609;
  string local_608;
  char *local_5e8;
  char *labelsForSubprojects;
  string local_5d8;
  char *local_5b8;
  char *useLaunchers;
  ostringstream local_590 [8];
  ostringstream ostr;
  string local_418 [32];
  undefined1 local_3f8 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  undefined1 local_208 [8];
  string buildCommand;
  string local_1e0;
  undefined1 local_1c0 [8];
  string dir;
  char *config;
  undefined1 local_190 [8];
  string e;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  byte local_123;
  byte local_122;
  allocator<char> local_121;
  string local_120;
  value_type local_100;
  char *cmakeBuildTarget;
  string local_f0;
  value_type local_d0;
  char *cmakeBuildAdditionalFlags;
  char *cmakeBuildConfiguration;
  string local_b8;
  char *local_98;
  char *ctestBuildConfiguration;
  string local_88;
  char *local_68;
  char *cmakeGeneratorName;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *ctestBuildCommand;
  cmCTestBuildHandler *handler;
  cmCTestBuildCommand *this_local;
  
  handler = (cmCTestBuildHandler *)this;
  ctestBuildCommand =
       (char *)cmCTest::GetBuildHandler
                         ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(((cmCTestBuildHandler *)ctestBuildCommand)->super_cmCTestGenericHandler).
    _vptr_cmCTestGenericHandler[3])();
  this->Handler = (cmCTestBuildHandler *)ctestBuildCommand;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CTEST_BUILD_COMMAND",&local_49);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = pcVar4;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"CTEST_CMAKE_GENERATOR",
               (allocator<char> *)((long)&ctestBuildConfiguration + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ctestBuildConfiguration + 7));
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_68 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"CTEST_BUILD_CONFIGURATION",
               (allocator<char> *)((long)&cmakeBuildConfiguration + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeBuildConfiguration + 7));
    local_98 = pcVar4;
    ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,10);
    if ((*ppcVar5 == (value_type)0x0) ||
       (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,10), **ppcVar5 == '\0')) {
      if ((local_98 == (char *)0x0) || (*local_98 == '\0')) {
        cmCTest::GetConfigType_abi_cxx11_
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        local_670 = (char *)std::__cxx11::string::c_str();
      }
      else {
        local_670 = local_98;
      }
      local_668 = local_670;
    }
    else {
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,10);
      local_668 = *ppcVar5;
    }
    cmakeBuildAdditionalFlags = local_668;
    ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0xb);
    cmakeBuildTarget._6_1_ = 0;
    cmakeBuildTarget._5_1_ = 0;
    if ((*ppcVar5 == (value_type)0x0) ||
       (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,0xb), **ppcVar5 == '\0')) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      cmakeBuildTarget._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"CTEST_BUILD_FLAGS",
                 (allocator<char> *)((long)&cmakeBuildTarget + 7));
      cmakeBuildTarget._5_1_ = 1;
      local_678 = cmMakefile::GetDefinition(pcVar1,&local_f0);
    }
    else {
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,0xb);
      local_678 = *ppcVar5;
    }
    if ((cmakeBuildTarget._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    if ((cmakeBuildTarget._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeBuildTarget + 7));
    }
    local_d0 = local_678;
    ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,9);
    local_122 = 0;
    local_123 = 0;
    if ((*ppcVar5 == (value_type)0x0) ||
       (ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&(this->super_cmCTestHandlerCommand).Values,9), **ppcVar5 == '\0')) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      local_122 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"CTEST_BUILD_TARGET",&local_121);
      local_123 = 1;
      local_6a0 = cmMakefile::GetDefinition(pcVar1,&local_120);
    }
    else {
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,9);
      local_6a0 = *ppcVar5;
    }
    if ((local_123 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_120);
    }
    if ((local_122 & 1) != 0) {
      std::allocator<char>::~allocator(&local_121);
    }
    local_100 = local_6a0;
    if ((local_68 == (char *)0x0) || (*local_68 == '\0')) {
      std::__cxx11::ostringstream::ostringstream(local_590);
      std::operator<<((ostream *)local_590,
                      "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                     );
      std::__cxx11::ostringstream::str();
      cmCommand::SetError((cmCommand *)this,(string *)&useLaunchers);
      std::__cxx11::string::~string((string *)&useLaunchers);
      this_local = (cmCTestBuildCommand *)0x0;
      std::__cxx11::ostringstream::~ostringstream(local_590);
      return (cmCTestGenericHandler *)this_local;
    }
    if (cmakeBuildAdditionalFlags == (char *)0x0) {
      cmakeBuildAdditionalFlags = "Release";
    }
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])();
      bVar3 = std::operator!=(&local_148,local_68);
      std::__cxx11::string::~string((string *)&local_148);
      if (bVar3) {
        if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
          (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
        }
        this->GlobalGenerator = (cmGlobalGenerator *)0x0;
      }
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      this_00 = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
      pcVar4 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,pcVar4,(allocator<char> *)(e.field_2._M_local_buf + 0xf));
      pcVar6 = cmake::CreateGlobalGenerator(this_00,&local_168);
      this->GlobalGenerator = pcVar6;
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_190,"could not create generator named \"",
                   (allocator<char> *)((long)&config + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&config + 7));
        std::__cxx11::string::operator+=((string *)local_190,local_68);
        std::__cxx11::string::operator+=((string *)local_190,"\"");
        cmMakefile::IssueMessage
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile
                   ,FATAL_ERROR,(string *)local_190);
        cmSystemTools::SetFatalErrorOccured();
        this_local = (cmCTestBuildCommand *)0x0;
        std::__cxx11::string::~string((string *)local_190);
        return (cmCTestGenericHandler *)this_local;
      }
    }
    sVar7 = strlen(cmakeBuildAdditionalFlags);
    if (sVar7 == 0) {
      dir.field_2._8_8_ = (long)"/Debug" + 1;
      cmakeBuildAdditionalFlags = "Debug";
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"BuildDirectory",
               (allocator<char> *)(buildCommand.field_2._M_local_buf + 0xf));
    cmCTest::GetCTestConfiguration((string *)local_1c0,pcVar2,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)(buildCommand.field_2._M_local_buf + 0xf));
    pcVar6 = this->GlobalGenerator;
    if (local_100 == (value_type)0x0) {
      local_720 = "";
    }
    else {
      local_720 = local_100;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,local_720,&local_229);
    pcVar4 = cmakeBuildAdditionalFlags;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,pcVar4,&local_251);
    if (local_d0 == (value_type)0x0) {
      local_748 = "";
    }
    else {
      local_748 = local_d0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,local_748,&local_279);
    bVar3 = cmMakefile::IgnoreErrorsCMP0061
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                       Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_208,pcVar6,&local_228,&local_250,&local_278,bVar3);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
    poVar8 = std::operator<<((ostream *)local_3f8,"SetMakeCommand:");
    poVar8 = std::operator<<(poVar8,(string *)local_208);
    std::operator<<(poVar8,"\n");
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildCommand.cxx"
                 ,0x78,pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string(local_418);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::SetCTestConfiguration
              (pcVar2,"MakeCommand",pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)local_1c0);
  }
  else {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",pcVar4,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"CTEST_USE_LAUNCHERS",
             (allocator<char> *)((long)&labelsForSubprojects + 7));
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&labelsForSubprojects + 7));
  local_5b8 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",pcVar4,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"CTEST_LABELS_FOR_SUBPROJECTS",&local_609);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  local_5e8 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  cmCTestGenericHandler::SetQuiet
            ((cmCTestGenericHandler *)ctestBuildCommand,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  return (cmCTestGenericHandler *)ctestBuildCommand;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestBuildHandler* handler = this->CTest->GetBuildHandler();
  handler->Initialize();

  this->Handler = handler;

  const char* ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (ctestBuildCommand && *ctestBuildCommand) {
    this->CTest->SetCTestConfiguration("MakeCommand", ctestBuildCommand,
                                       this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    const char* ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    const char* cmakeBuildConfiguration =
      (this->Values[ctb_CONFIGURATION] && *this->Values[ctb_CONFIGURATION])
      ? this->Values[ctb_CONFIGURATION]
      : ((ctestBuildConfiguration && *ctestBuildConfiguration)
           ? ctestBuildConfiguration
           : this->CTest->GetConfigType().c_str());

    const char* cmakeBuildAdditionalFlags =
      (this->Values[ctb_FLAGS] && *this->Values[ctb_FLAGS])
      ? this->Values[ctb_FLAGS]
      : this->Makefile->GetDefinition("CTEST_BUILD_FLAGS");
    const char* cmakeBuildTarget =
      (this->Values[ctb_TARGET] && *this->Values[ctb_TARGET])
      ? this->Values[ctb_TARGET]
      : this->Makefile->GetDefinition("CTEST_BUILD_TARGET");

    if (cmakeGeneratorName && *cmakeGeneratorName) {
      if (!cmakeBuildConfiguration) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != cmakeGeneratorName) {
          delete this->GlobalGenerator;
          this->GlobalGenerator = nullptr;
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = "could not create generator named \"";
          e += cmakeGeneratorName;
          e += "\"";
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccured();
          return nullptr;
        }
      }
      if (strlen(cmakeBuildConfiguration) == 0) {
        const char* config = nullptr;
#ifdef CMAKE_INTDIR
        config = CMAKE_INTDIR;
#endif
        if (!config) {
          config = "Debug";
        }
        cmakeBuildConfiguration = config;
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget ? cmakeBuildTarget : "", cmakeBuildConfiguration,
          cmakeBuildAdditionalFlags ? cmakeBuildAdditionalFlags : "",
          this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand.c_str(),
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (const char* useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", useLaunchers,
                                       this->Quiet);
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}